

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O2

PersistentColumnData * __thiscall
duckdb::ArrayColumnCheckpointState::ToPersistentData
          (PersistentColumnData *__return_storage_ptr__,ArrayColumnCheckpointState *this)

{
  pointer pCVar1;
  PersistentColumnData PStack_58;
  
  PersistentColumnData::PersistentColumnData(__return_storage_ptr__,ARRAY);
  pCVar1 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->(&this->validity_state);
  (*pCVar1->_vptr_ColumnCheckpointState[5])(&PStack_58,pCVar1);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(__return_storage_ptr__->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&PStack_58);
  PersistentColumnData::~PersistentColumnData(&PStack_58);
  pCVar1 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->(&this->child_state);
  (*pCVar1->_vptr_ColumnCheckpointState[5])(&PStack_58,pCVar1);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(__return_storage_ptr__->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&PStack_58);
  PersistentColumnData::~PersistentColumnData(&PStack_58);
  return __return_storage_ptr__;
}

Assistant:

PersistentColumnData ToPersistentData() override {
		PersistentColumnData data(PhysicalType::ARRAY);
		data.child_columns.push_back(validity_state->ToPersistentData());
		data.child_columns.push_back(child_state->ToPersistentData());
		return data;
	}